

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeFindTreesTest(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *vAdds;
  abctime aVar5;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  abctime time;
  abctime time_00;
  uint i;
  char *pcVar6;
  
  aVar4 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds);
  pcVar6 = (char *)((long)vAdds->nSize / 6 & 0xffffffff);
  printf("Detected %d adders (%d FAs and %d HAs).  ",pcVar6,(ulong)uVar1);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar6,time);
  aVar4 = Abc_Clock();
  p_00 = Acec_TreeFindTrees(p,vAdds,(Vec_Bit_t *)0x0,0,0);
  uVar1 = p_00->nSize;
  iVar2 = Vec_WecSizeSize(p_00);
  pcVar6 = (char *)(ulong)uVar1;
  printf("Collected %d trees with %d adders in them.  ",pcVar6,(long)iVar2 / 2 & 0xffffffff);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar6,time_00);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (i = 0; i != uVar1; i = i + 1) {
    p_01 = Vec_WecEntry(p_00,i);
    printf(" %4d : {",(ulong)i);
    for (iVar2 = 0; iVar2 < p_01->nSize; iVar2 = iVar2 + 1) {
      uVar3 = Vec_IntEntry(p_01,iVar2);
      printf(" %d",(ulong)uVar3);
    }
    puts(" }");
  }
  Vec_WecFree(p_00);
  Vec_IntFree(vAdds);
  return;
}

Assistant:

void Acec_TreeFindTreesTest( Gia_Man_t * p )
{
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WecPrint( vTrees, 0 );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}